

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.cpp
# Opt level: O1

void __thiscall
SpecialFormPackage::SpecialFormPackage
          (SpecialFormPackage *this,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>_>_>
          *map)

{
  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
  *this_00;
  mapped_type *this_01;
  _Rb_tree_node_base *p_Var1;
  
  for (p_Var1 = (map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(map->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    this_00 = (_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               *)Registry<std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>
                 ::instance();
    this_01 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[](this_00,(key_type *)(p_Var1 + 1));
    std::
    function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>
    ::operator=(this_01,(function<ExecutionResult_(const_std::__cxx11::list<std::shared_ptr<ASTNode>,_std::allocator<std::shared_ptr<ASTNode>_>_>_&,_const_Context_&)>
                         *)(p_Var1 + 2));
  }
  return;
}

Assistant:

SpecialFormPackage::SpecialFormPackage(const std::map<std::string, SpecialForm > &map)
{
    for(auto &&p : map)
    {
        SpecialFormRegistry::add(p.first, p.second);
    }
}